

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcCommon.h
# Opt level: O0

void o3dgc::SphereToCube<float>(float x,float y,float z,float *a,float *b,char *index)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float az;
  float ay;
  float ax;
  char *index_local;
  float *b_local;
  float *a_local;
  float local_10;
  float z_local;
  float y_local;
  float x_local;
  
  a_local._4_4_ = z;
  local_10 = y;
  z_local = x;
  fVar1 = absolute<float>(&z_local);
  fVar2 = absolute<float>(&local_10);
  fVar3 = absolute<float>((float *)((long)&a_local + 4));
  if ((fVar3 < fVar1) || (fVar3 < fVar2)) {
    if ((fVar2 < fVar1) || (fVar2 < fVar3)) {
      if ((fVar2 <= fVar1) && (fVar3 <= fVar1)) {
        if (z_local < 0.0) {
          *index = '\x05';
          *a = -local_10;
          *b = -a_local._4_4_;
        }
        else {
          *index = '\x04';
          *a = local_10;
          *b = a_local._4_4_;
        }
      }
    }
    else if (local_10 < 0.0) {
      *index = '\x03';
      *a = -a_local._4_4_;
      *b = -z_local;
    }
    else {
      *index = '\x02';
      *a = a_local._4_4_;
      *b = z_local;
    }
  }
  else if (a_local._4_4_ < 0.0) {
    *index = '\x01';
    *a = -z_local;
    *b = -local_10;
  }
  else {
    *index = '\0';
    *a = z_local;
    *b = local_10;
  }
  return;
}

Assistant:

inline void SphereToCube(const T x, const T y, const T z, 
                             T & a, T & b, char & index)
    {
        T ax = absolute(x);
        T ay = absolute(y);
        T az = absolute(z);
        if (az >= ax && az >= ay)
        {
            if (z >= (T)(0))
            {
                index = 0;
                a = x;
                b = y;
            }
            else
            {
                index = 1;
                a = -x;
                b = -y;
            }
        }
        else if (ay >= ax && ay >= az)
        {
            if (y >= (T)(0))
            {
                index = 2;
                a = z;
                b = x;
            }
            else
            {
                index = 3;
                a = -z;
                b = -x;
            }
        }
        else if (ax >= ay && ax >= az)
        {
            if (x >= (T)(0))
            {
                index = 4;
                a = y;
                b = z;
            }
            else
            {
                index = 5;
                a = -y;
                b = -z;
            }
        }
    }